

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O3

void dumb_end_resampler_n(int n,DUMB_RESAMPLER *resampler)

{
  if (resampler != (DUMB_RESAMPLER *)0x0) {
    free(resampler);
    return;
  }
  return;
}

Assistant:

void dumb_end_resampler_n(int n, DUMB_RESAMPLER *resampler)
{
	if (n == 8)
		dumb_end_resampler_8(resampler);
	else if (n == 16)
		dumb_end_resampler_16(resampler);
	else
		dumb_end_resampler(resampler);
}